

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execBitDxEa<(moira::Instr)30,(moira::Mode)0,(moira::Size)4>(Moira *this,u16 opcode)

{
  byte bit;
  u32 uVar1;
  uint uVar2;
  Moira *in_RDI;
  u32 data;
  u8 b;
  int dst;
  int src;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  uVar1 = readD<(moira::Size)4>
                    ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RDI >> 0x20));
  bit = (byte)uVar1 & 0x1f;
  uVar1 = readD<(moira::Size)4>
                    ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RDI >> 0x20));
  uVar1 = bit<(moira::Instr)30>(in_RDI,uVar1,bit);
  prefetch<4ul>((Moira *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
  uVar2 = cyclesBit<(moira::Instr)30>(in_RDI,bit);
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,(ulong)uVar2);
  writeD<(moira::Size)4>
            ((Moira *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),(int)((ulong)in_RDI >> 0x20),
             (u32)in_RDI);
  return;
}

Assistant:

void
Moira::execBitDxEa(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    switch (M) {

        case 0:
        {
            u8 b = readD(src) & 0b11111;
            u32 data = readD(dst);
            data = bit<I>(data, b);

            prefetch<POLLIPL>();

            sync(cyclesBit<I>(b));
            if (I != BTST) writeD(dst, data);
            break;
        }
        default:
        {
            u8 b = readD(src) & 0b111;

            u32 ea, data;
            if (!readOp<M, Byte>(dst, ea, data)) return;

            data = bit<I>(data, b);

            if (I != BTST) {
                prefetch();
                writeM<M, Byte, POLLIPL>(ea, data);
            } else {
                prefetch<POLLIPL>();
            }
        }
    }
}